

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O3

void gai_setup_2d_patch(Integer rank,char *trans,Integer *dims,Integer *lo,Integer *hi,Integer *ilo,
                       Integer *ihi,Integer *jlo,Integer *jhi,Integer *dim1,Integer *dim2,int *ipos,
                       int *jpos,int *vpos,int vec_idx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  if (rank < 1) {
    uVar2 = 0xffffffff;
    *vpos = -1;
    *jpos = -1;
    *ipos = -1;
LAB_001303e0:
    bVar1 = true;
    if (-1 < *jpos) goto LAB_001303e9;
    *ipos = 0;
LAB_0013043d:
    *jpos = 1;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      if ((lo[lVar5] < hi[lVar5]) && (iVar6 = iVar3 + 1, bVar1 = 1 < iVar3, iVar3 = iVar6, bVar1)) {
        pnga_error("3-D Patch Detected",0);
      }
      lVar5 = lVar5 + 1;
    } while (rank != lVar5);
    uVar2 = 0xffffffff;
    *vpos = -1;
    *jpos = -1;
    *ipos = -1;
    if (0 < rank) {
      uVar2 = 0xffffffff;
      lVar5 = 0;
      do {
        uVar4 = (uint)lVar5;
        if ((int)uVar2 < 0) {
          if (lo[lVar5] < hi[lVar5]) {
            *ipos = uVar4;
            uVar2 = uVar4;
          }
        }
        else if (lo[lVar5] < hi[lVar5]) {
          *jpos = uVar4;
          uVar2 = *ipos;
          break;
        }
        lVar5 = lVar5 + 1;
      } while (rank != lVar5);
    }
    if (((iVar3 == 1) && (uVar2 != 0)) && (rank + -1 != (long)(int)uVar2)) {
      *vpos = uVar2;
      uVar2 = *ipos;
    }
    if ((int)uVar2 < 0) goto LAB_001303e0;
    bVar1 = false;
LAB_001303e9:
    if ((trans == (char *)0x0) || ((byte)(*trans | 0x20U) == 0x6e)) {
      if (rank + -1 == (long)(int)uVar2) {
        uVar2 = uVar2 - 1;
        *ipos = uVar2;
      }
      iVar3 = *jpos;
      if ((int)uVar2 < 0) {
        uVar2 = iVar3 - 1;
        *ipos = uVar2;
        iVar3 = *jpos;
      }
      if (-1 < iVar3) goto LAB_00130469;
      uVar2 = uVar2 + 1;
    }
    else {
      iVar3 = *jpos;
      if (bVar1) {
        uVar2 = iVar3 - 1;
        *ipos = uVar2;
        iVar3 = *jpos;
      }
      if (-1 < iVar3) goto LAB_00130469;
      if (vec_idx < 0) {
        if (uVar2 == 0) goto LAB_0013043d;
        *ipos = uVar2 - 1;
      }
      else {
        if ((int)uVar2 < vec_idx) {
          *jpos = vec_idx;
          goto LAB_00130469;
        }
        if ((uint)vec_idx < uVar2) {
          *jpos = uVar2;
          *ipos = vec_idx;
          goto LAB_00130469;
        }
        if (uVar2 == 0) {
          *jpos = 1;
          *ipos = 0;
          goto LAB_00130469;
        }
      }
    }
    *jpos = uVar2;
  }
LAB_00130469:
  iVar3 = *ipos;
  *ilo = lo[iVar3];
  *ihi = hi[iVar3];
  iVar6 = *jpos;
  *jlo = lo[iVar6];
  *jhi = hi[iVar6];
  *dim1 = dims[iVar3];
  *dim2 = dims[iVar6];
  return;
}

Assistant:

static void  gai_setup_2d_patch(Integer rank, char *trans, Integer dims[],
                                Integer lo[], Integer hi[],
                                Integer* ilo, Integer* ihi,
                                Integer* jlo, Integer* jhi,
                                Integer* dim1, Integer* dim2,
                                int* ipos, int* jpos, int *vpos, int vec_idx)
{
    int d,e=0,f=0;
    char t='n';
    int reset_t = 0;
    int tmp;
    
    /* check to see if more than two dimensions of patch have
     * size greater than 1*/
    for(d=0; d<rank; d++)
       if( (hi[d]-lo[d])>0 && ++e>2 ) pnga_error("3-D Patch Detected", 0L);
    /* determine two locations where patch dimensions are greater than 1*/
    *ipos = *jpos = *vpos = -1;
    for(d=0; d<rank; d++){
       if( (*ipos <0) && (hi[d]>lo[d]) ) { *ipos =d; continue; }
       if( (*ipos >=0) && (hi[d]>lo[d])) { *jpos =d; break; }
    }
    /* we have an ambiguous vector; mark its location */
    if (1 == e && *ipos != 0 && *ipos != rank-1) {
        *vpos = *ipos;
    }

    /*    if(*ipos >*jpos){Integer t=*ipos; *ipos=*jpos; *jpos=t;} 
     */
    
    /* single element case (trivial) */
    if((*ipos <0) && (*jpos <0)){ *ipos =0; *jpos=1; }
    else{
       
       if(trans == NULL) {
         trans = &t;      
         reset_t = 1;
       }
       /* handle almost trivial case of only one dimension with >1 elements.
        * None of the conditions in this block are true for a 2D block with more
        * than 1 element in each of the 2 dimensions so no need to specify
        * condition that e == 1 */
       if(*trans == 'n' || *trans == 'N') {
          if(*ipos == rank-1) (*ipos)--; /* i cannot be the last dimension */
          if(*ipos <0) *ipos = *jpos-1; /* select i dimension based on j */
          if(*jpos <0) *jpos = *ipos+1; /* select j dimenison based on i */
       }
       else {
          if(*ipos <0) *ipos = *jpos-1; /* this condition is probably never reached */
          if(*jpos <0) {
            if (vec_idx < 0) {
              if(*ipos==0) *jpos = *ipos + 1; 
              else         *jpos = (*ipos)--;
            } else {
              if (*ipos < vec_idx) {
                *jpos = vec_idx;
              } else if (*ipos > vec_idx) {
                *jpos = *ipos;
                *ipos = vec_idx;
              } else {
                /* this is probably an error if you get this far */
                if (*ipos > 0) {
                  *jpos = *ipos;
		  // fix for -Wunused             *ipos--;
                } else {
                  *jpos = 1;
                  *ipos = 0;
                }
              }
            }
          }
       }
       if (reset_t) trans = NULL;
    }
    
    *ilo = lo[*ipos]; *ihi = hi[*ipos];
    *jlo = lo[*jpos]; *jhi = hi[*jpos];
    *dim1 = dims[*ipos];
    *dim2 = dims[*jpos];
#if 0
    printf("lo/hi=[%ld:%ld", lo[0], hi[0]);
    for (d=1; d<rank; ++d) {
        printf(",%ld:%ld", lo[d], hi[d]);
    }
    printf("]\n");
    printf("size=[%ld", hi[0]-lo[0]+1);
    for (d=1; d<rank; ++d) {
        printf(",%ld", hi[d]-lo[d]+1);
    }
    printf("]\n");
    printf("gai_setup_2d_patch(%ld, T, X, X, X, %ld, %ld, %ld, %ld, %ld, %ld, %d, %d, %d)\n",
            rank, *ilo, *ihi, *jlo, *jhi, *dim1, *dim2, *ipos, *jpos, *vpos);
#endif
}